

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingFundamentals.cpp
# Opt level: O2

void logSigned<short>(void)

{
  Session *this;
  atomic<unsigned_long> eventSourceId;
  cx_string<4UL> cVar1;
  SessionWriter *pSVar2;
  __atomic_base<unsigned_long> _Var3;
  nanoseconds clock;
  short b;
  short a;
  short local_f4 [2];
  allocator local_ef;
  allocator local_ee;
  allocator local_ed;
  allocator local_ec;
  allocator local_eb;
  short local_ea;
  undefined4 local_e8;
  char local_e4;
  undefined1 local_e0 [48];
  string local_b0 [32];
  string local_90 [32];
  uint64_t local_70;
  string local_68 [32];
  string local_48 [32];
  
  local_f4[1] = 0xffec;
  local_f4[0] = 0x1e;
  pSVar2 = binlog::default_thread_local_writer();
  if ((pSVar2->_session->_minSeverity)._M_i < 0x81) {
    if (logSigned<short>::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      this = pSVar2->_session;
      local_e0._0_8_ = 0;
      local_e0._8_2_ = info;
      std::__cxx11::string::string((string *)(local_e0 + 0x10),"main",&local_eb);
      std::__cxx11::string::string(local_b0,"logSigned",&local_ec);
      std::__cxx11::string::string
                (local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/LoggingFundamentals.cpp"
                 ,&local_ed);
      local_70 = 0xc;
      std::__cxx11::string::string(local_68,"{} {} {} {}",&local_ee);
      local_ea = -0x28;
      cVar1 = binlog::detail::
              concatenated_tags<char_const(&)[12],short&,short_const&,short_const&,short>
                        ((char (*) [12])"{} {} {} {}",local_f4 + 1,local_f4,local_f4,&local_ea);
      local_e8 = cVar1._data._0_4_;
      local_e4 = cVar1._data[4];
      std::__cxx11::string::string(local_48,(char *)&local_e8,&local_ef);
      _Var3._M_i = binlog::Session::addEventSource(this,(EventSource *)local_e0);
      binlog::EventSource::~EventSource((EventSource *)local_e0);
      LOCK();
      UNLOCK();
      logSigned<short>::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
    }
    eventSourceId.super___atomic_base<unsigned_long>._M_i =
         logSigned<short>::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    pSVar2 = binlog::default_thread_local_writer();
    clock = binlog::clockSinceEpoch();
    local_e8 = CONCAT22(local_e8._2_2_,0xffd8);
    binlog::SessionWriter::addEvent<short&,short_const&,short_const&,short>
              (pSVar2,(uint64_t)eventSourceId.super___atomic_base<unsigned_long>._M_i,clock.__r,
               local_f4 + 1,local_f4,local_f4,(short *)&local_e8);
  }
  return;
}

Assistant:

void logSigned()
{
  T a = -20;
  const T b = 30;
  const T& c = b;
  BINLOG_INFO("{} {} {} {}", a, b, c, T(-40));
}